

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

bounded_buffer * peparse::splitBuffer(bounded_buffer *b,uint32_t from,uint32_t to)

{
  bounded_buffer *__s;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  bounded_buffer *newBuff;
  bounded_buffer *local_38;
  bounded_buffer *local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = (bounded_buffer *)0x0;
  }
  else if ((in_EDX < in_ESI) || (*(uint *)(in_RDI + 1) < in_EDX)) {
    local_8 = (bounded_buffer *)0x0;
  }
  else {
    __s = (bounded_buffer *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    local_38 = (bounded_buffer *)0x0;
    if (__s != (bounded_buffer *)0x0) {
      memset(__s,0,0x18);
      local_38 = __s;
    }
    if (local_38 == (bounded_buffer *)0x0) {
      local_8 = (bounded_buffer *)0x0;
    }
    else {
      local_38->copy = true;
      local_38->buf = (uint8_t *)(*in_RDI + (ulong)in_ESI);
      local_38->bufLen = in_EDX - in_ESI;
      local_8 = local_38;
    }
  }
  return local_8;
}

Assistant:

bounded_buffer *
splitBuffer(bounded_buffer *b, std::uint32_t from, std::uint32_t to) {
  if (b == nullptr) {
    return nullptr;
  }

  // safety checks
  if (to < from || to > b->bufLen) {
    return nullptr;
  }

  // make a new buffer
  auto newBuff = new (std::nothrow) bounded_buffer();
  if (newBuff == nullptr) {
    return nullptr;
  }

  newBuff->copy = true;
  newBuff->buf = b->buf + from;
  newBuff->bufLen = (to - from);

  return newBuff;
}